

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.h
# Opt level: O2

void __thiscall StackVector<CMString>::Push(StackVector<CMString> *this,CMString In)

{
  long lVar1;
  
  lVar1 = (long)this->CurSize;
  if (lVar1 < 0x40) {
    this->CurSize = this->CurSize + 1;
    this->Stack[lVar1].Hash = In.Hash;
    this->Stack[lVar1].Str = In.Str;
    this->Stack[lVar1].Len = In.Len;
  }
  else {
    std::vector<CMString,_std::allocator<CMString>_>::push_back(&this->Heap,&In);
    this->CurSize = this->CurSize + 1;
  }
  return;
}

Assistant:

void Push(T In)
	{
		if (CurSize + 1 > STACKVECTOR_SIZE) {
			Heap.push_back(In);
			CurSize++;
		} else {
			Stack[CurSize++] = In;
		}
	}